

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O2

void __thiscall xe::TestResultParser::~TestResultParser(TestResultParser *this)

{
  std::__cxx11::string::~string((string *)&this->m_curNumValue);
  std::_Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>::~_Vector_base
            (&(this->m_itemStack).
              super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>);
  xml::Parser::~Parser(&this->m_xmlParser);
  return;
}

Assistant:

TestResultParser::~TestResultParser (void)
{
}